

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgUtils.hpp
# Opt level: O3

unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> __thiscall
TasGrid::Utils::make_unique<TasGrid::GridGlobal,TasGrid::AccelerationContext_const*&>
          (Utils *this,AccelerationContext **args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x300);
  puVar1[1] = *args;
  *(undefined4 *)(puVar1 + 4) = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined4 *)(puVar1 + 9) = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  *puVar1 = &PTR__GridGlobal_001f71c0;
  *(undefined4 *)(puVar1 + 0x12) = 0;
  *(undefined8 *)((long)puVar1 + 0xac) = 0;
  puVar1[0x57] = 0;
  puVar1[0x58] = 0;
  puVar1[0x55] = 0;
  puVar1[0x56] = 0;
  puVar1[0x53] = 0;
  puVar1[0x54] = 0;
  puVar1[0x51] = 0;
  puVar1[0x52] = 0;
  puVar1[0x4f] = 0;
  puVar1[0x50] = 0;
  puVar1[0x4d] = 0;
  puVar1[0x4e] = 0;
  *(undefined1 *)(puVar1 + 0x15) = 0;
  puVar1[0x13] = 0;
  puVar1[0x14] = 0;
  memset(puVar1 + 0x17,0,0xb4);
  puVar1[0x2e] = 0;
  puVar1[0x2f] = 0;
  puVar1[0x30] = 0;
  puVar1[0x31] = 0;
  *(undefined4 *)(puVar1 + 0x32) = 0;
  puVar1[0x33] = 0;
  puVar1[0x34] = 0;
  puVar1[0x35] = 0;
  puVar1[0x36] = 0;
  puVar1[0x37] = 0;
  puVar1[0x38] = 0;
  puVar1[0x39] = 0;
  puVar1[0x3a] = 0;
  puVar1[0x3b] = 0;
  puVar1[0x3c] = 0;
  puVar1[0x3d] = 0;
  puVar1[0x3e] = 0;
  *(undefined8 *)((long)puVar1 + 500) = 0;
  *(undefined8 *)((long)puVar1 + 0x1fc) = 0;
  puVar1[0x41] = 0;
  puVar1[0x42] = 0;
  puVar1[0x43] = 0;
  puVar1[0x44] = 0;
  *(undefined4 *)(puVar1 + 0x45) = 0;
  puVar1[0x46] = 0;
  puVar1[0x47] = 0;
  puVar1[0x48] = 0;
  puVar1[0x49] = 0;
  puVar1[0x4a] = 0;
  puVar1[0x4b] = 0;
  *(undefined4 *)(puVar1 + 0x4c) = 0;
  puVar1[0x59] = puVar1 + 0x5b;
  puVar1[0x5a] = 0;
  *(undefined1 *)(puVar1 + 0x5b) = 0;
  puVar1[0x5d] = 0;
  puVar1[0x5e] = 0;
  puVar1[0x5f] = 0;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
         )(__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args){
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}